

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::rangeToString<wchar_t_const*,wchar_t_const*>
          (string *__return_storage_ptr__,Detail *this,wchar_t *first,wchar_t *last)

{
  Detail *value;
  ReusableStringStream rss;
  type local_68;
  ReusableStringStream local_48;
  
  ReusableStringStream::ReusableStringStream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_48.m_oss,"{ ",2);
  if (this != (Detail *)first) {
    StringMaker<wchar_t,_void>::convert<wchar_t>(&local_68,(wchar_t *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_48.m_oss,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    for (value = this + 4; value != (Detail *)first; value = value + 4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_48.m_oss,", ",2);
      StringMaker<wchar_t,_void>::convert<wchar_t>(&local_68,(wchar_t *)value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_48.m_oss,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_48.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_48);
  ReusableStringStream::~ReusableStringStream(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }